

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eimgfs.cpp
# Opt level: O2

bool __thiscall
XipFile::extractfile(XipFile *this,string *romname,string *dstpath,filetypefilter_ptr *filter)

{
  element_type *peVar1;
  element_type *peVar2;
  int iVar3;
  iterator iVar4;
  FileReader *__p;
  bool bVar5;
  XipEntry_ptr srcfile;
  ReadWriter_ptr w;
  undefined1 local_60 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_58;
  shared_ptr<FileReader> dstfile;
  __shared_ptr<ReadWriter,_(__gnu_cxx::_Lock_policy)2> local_40;
  
  iVar4 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<XipFile::XipEntry>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<XipFile::XipEntry>_>_>,_caseinsensitive,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<XipFile::XipEntry>_>_>_>
          ::find(&(this->_files)._M_t,romname);
  if ((_Rb_tree_header *)iVar4._M_node == &(this->_files)._M_t._M_impl.super__Rb_tree_header) {
    printf("extract: %s not found\n",(romname->_M_dataplus)._M_p);
    return false;
  }
  if (g_verbose != 0) {
    XipEntry::listentry(*(XipEntry **)(iVar4._M_node + 2),this);
  }
  std::__shared_ptr<XipFile::XipEntry,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&srcfile.super___shared_ptr<XipFile::XipEntry,_(__gnu_cxx::_Lock_policy)2>,
             (__shared_ptr<XipFile::XipEntry,_(__gnu_cxx::_Lock_policy)2> *)(iVar4._M_node + 2));
  peVar1 = (filter->super___shared_ptr<filetypefilter,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  if (peVar1 != (element_type *)0x0) {
    (*(srcfile.super___shared_ptr<XipFile::XipEntry,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
      _vptr_XipEntry[6])
              (local_60,srcfile.super___shared_ptr<XipFile::XipEntry,_(__gnu_cxx::_Lock_policy)2>.
                        _M_ptr,this);
    iVar3 = (*peVar1->_vptr_filetypefilter[2])(peVar1,local_60);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_58);
    if ((char)iVar3 == '\0') {
      if (g_verbose < 2) {
        bVar5 = false;
      }
      else {
        bVar5 = false;
        printf("filtered %s\n",(romname->_M_dataplus)._M_p);
      }
      goto LAB_00119441;
    }
  }
  __p = (FileReader *)operator_new(0x40);
  FileReader::FileReader(__p,dstpath);
  std::__shared_ptr<ReadWriter,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<FileReader,void>
            ((__shared_ptr<ReadWriter,(__gnu_cxx::_Lock_policy)2> *)&w,__p);
  peVar2 = srcfile.super___shared_ptr<XipFile::XipEntry,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  std::__shared_ptr<ReadWriter,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_40,&w.super___shared_ptr<ReadWriter,_(__gnu_cxx::_Lock_policy)2>);
  (*peVar2->_vptr_XipEntry[4])(peVar2,this,&local_40);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_40._M_refcount);
  std::dynamic_pointer_cast<FileReader,ReadWriter>((shared_ptr<ReadWriter> *)&dstfile);
  if (dstfile.super___shared_ptr<FileReader,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
      (element_type *)0x0) {
    FileReader::setunixtime
              (dstfile.super___shared_ptr<FileReader,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
               (srcfile.super___shared_ptr<XipFile::XipEntry,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
               _filetime / 10000000 - 0x2b6109100);
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&dstfile.super___shared_ptr<FileReader,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&w.super___shared_ptr<ReadWriter,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  bVar5 = true;
LAB_00119441:
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&srcfile.super___shared_ptr<XipFile::XipEntry,_(__gnu_cxx::_Lock_policy)2>._M_refcount)
  ;
  return bVar5;
}

Assistant:

virtual bool extractfile(const std::string&romname, const std::string& dstpath, filetypefilter_ptr filter)
    {
        filemap_t::iterator fi= _files.find(romname);
        if (fi==_files.end()) {
            printf("extract: %s not found\n", romname.c_str());
            return false;
        }

        if (g_verbose)
            (*fi).second->listentry(*this);

        XipEntry_ptr srcfile= (*fi).second;
        if (filter && !filter->match(srcfile->getdatareader(*this))) {
            if (g_verbose > 1)
                printf("filtered %s\n", romname.c_str());
            return false;
        }

        ReadWriter_ptr w(new FileReader(dstpath, FileReader::createnew));

        srcfile->tostream(*this, w);

        std::shared_ptr<FileReader> dstfile= std::dynamic_pointer_cast<FileReader>(w);
        if (dstfile) {
            try {
            dstfile->setunixtime(srcfile->getunixtime());
            }
            catch(...)
            {
                printf("xip.get: error setting filetime\n");
            }
        }
        return true;
    }